

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::simpleExpression(Parse *this)

{
  Type TVar1;
  Type TVar2;
  pointer pvVar3;
  long lVar4;
  SymbolTable *pSVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  Parse *this_00;
  char *this_01;
  long lVar10;
  Type helper_Type;
  string local_b8;
  string helper;
  SymbolTableElement local_78;
  
  iVar8 = this->curIndex;
  helper._M_dataplus._M_p = (pointer)&helper.field_2;
  helper._M_string_length = 0;
  helper.field_2._M_local_buf[0] = '\0';
  iVar7 = additiveExpression(this);
  if (iVar7 == 0) {
    this->curIndex = iVar8;
    iVar8 = 0;
  }
  else {
    this_00 = (Parse *)&this->relopTmp;
    std::__cxx11::string::_M_assign((string *)&helper);
    TVar1 = this->relopType;
    helper_Type = TVar1;
    iVar8 = relop(this);
    if (iVar8 != 0) {
      iVar8 = additiveExpression(this);
      if (iVar8 == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_280f8 + 9);
        std::endl<char,std::char_traits<char>>(poVar9);
LAB_0010b05f:
        exit(0);
      }
      TVar2 = this->relopType;
      if (((TVar2 < ARRAY) && ((0x16U >> (TVar2 & 0x1f) & 1) != 0)) && (TVar1 == CHAR)) {
        toSymTypeName_abi_cxx11_(&local_78.name,this_00,&helper_Type);
        poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
        this_01 = anon_var_dwarf_280c4;
        poVar9 = std::operator<<(poVar9,anon_var_dwarf_280c4);
        toSymTypeName_abi_cxx11_(&local_b8,(Parse *)this_01,&this->relopType);
        poVar9 = std::operator<<(poVar9,(string *)&local_b8);
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_78);
        goto LAB_0010b05f;
      }
      iVar8 = this->t_num + 1;
      this->t_num = iVar8;
      std::__cxx11::to_string(&local_b8,iVar8);
      std::operator+(&local_78.name,"t",&local_b8);
      std::__cxx11::string::operator=((string *)&this->curTmpName,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,&this->relopName,
                 &helper,&this->relopTmp,&this->curTmpName);
      local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
      local_78.pfinalind = 0;
      local_78._60_4_ = 0;
      local_78.constNum = 0.0;
      local_78.type = 0;
      local_78.cat = 0;
      local_78.ctInd = 0;
      local_78.len = 0;
      local_78.name.field_2._M_allocated_capacity = 0;
      local_78.name.field_2._8_8_ = 0;
      local_78.name._M_string_length = 0;
      local_78.aiInd = 0;
      local_78.vall = 0;
      local_78.isTemp = false;
      local_78.isActive = true;
      local_78._74_6_ = 0;
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
      emplace_back<SymbolTableElement>
                ((this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->curFun,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pvVar3 = (this->st->symbolTable).
               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&pvVar3[this->curFun].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      lVar10 = (((long)*(pointer *)
                        ((long)&pvVar3[this->curFun].
                                super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar4) / 0x50 + -1) * 0x50;
      std::__cxx11::string::_M_assign((string *)(lVar4 + lVar10));
      pSVar5 = this->st;
      iVar8 = this->curFun;
      lVar4 = *(long *)&(pSVar5->symbolTable).
                        super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar8].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      *(undefined8 *)(lVar4 + 0x20 + lVar10) = 0x200000004;
      *(undefined2 *)(lVar4 + 0x48 + lVar10) = 1;
      piVar6 = (pSVar5->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = piVar6[iVar8];
      *(int *)(lVar4 + 0x34 + lVar10) = iVar7;
      piVar6[iVar8] = iVar7 + 1;
      std::__cxx11::string::_M_assign((string *)&this->expName);
    }
    std::__cxx11::string::_M_assign((string *)&this->simExpName);
    this->simExpType = this->relopType;
    iVar8 = 1;
  }
  std::__cxx11::string::~string((string *)&helper);
  return iVar8;
}

Assistant:

int Parse::simpleExpression() {
    int index = curIndex;
    string helper;
    Type helper_Type;
    if(additiveExpression()) {
        helper = relopTmp;
        helper_Type = relopType;
        if(relop()) {
            if (additiveExpression()) {
                if(!typePriority(relopType, helper_Type)) {
//                    cout << helper_Type << " " << relopType << endl;
                    cout << toSymTypeName(helper_Type) <<"类型不匹配" << toSymTypeName(relopType)<< endl;
                    exit(0);
                }
                curTmpName = "t" + to_string(++t_num);
                quadVec.emplace_back(relopName, helper, relopTmp, curTmpName);
                st.symbolTable[curFun].push_back(SymbolTableElement());
                auto symInd = st.symbolTable[curFun].size() - 1;
                st.symbolTable[curFun][symInd].name = curTmpName;
                st.symbolTable[curFun][symInd].type = Type::BOOL;
                st.symbolTable[curFun][symInd].cat = Category ::CONST;
                st.symbolTable[curFun][symInd].isTemp = true;
                st.symbolTable[curFun][symInd].isActive = false;
                st.symbolTable[curFun][symInd].vall = st.vallVec[curFun];
                st.vallVec[curFun] += 1;
                expName = curTmpName;
            } else {
                cout << "表达式错误" << endl;
                exit(0);
            }
        }
        simExpName = relopTmp;
        simExpType = relopType;
        return 1;
    }
    curIndex = index;
    return 0;
}